

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_pass.cc
# Opt level: O3

ssize_t sock_fd_write(int sock,void *buf,ssize_t buflen,int fd)

{
  ssize_t sVar1;
  iovec iov;
  anon_union_24_2_2032e646 cmsgu;
  msghdr local_78;
  iovec local_40;
  undefined8 local_30;
  undefined8 local_28;
  int local_20;
  
  local_78.msg_iov = &local_40;
  local_78.msg_name = (void *)0x0;
  local_78.msg_namelen = 0;
  local_78.msg_iovlen = 1;
  local_40.iov_base = buf;
  local_40.iov_len = buflen;
  if (fd == -1) {
    local_78.msg_control = (undefined8 *)0x0;
    local_78.msg_controllen = 0;
    puts("not passing fd");
  }
  else {
    local_78.msg_control = &local_30;
    local_78.msg_controllen = 0x18;
    local_30 = 0x14;
    local_28 = 0x100000001;
    printf("passing fd %d\n",(ulong)(uint)fd);
    local_20 = fd;
  }
  sVar1 = sendmsg(sock,&local_78,0);
  if (sVar1 < 0) {
    perror("sendmsg");
  }
  return sVar1;
}

Assistant:

ssize_t sock_fd_write(int sock, void *buf, ssize_t buflen, int fd)
{
    ssize_t size;
    struct msghdr msg;
    struct iovec iov;
    union{
        struct cmsghdr cmsghdr;
        char control[CMSG_SPACE(sizeof (int))];
    } cmsgu;
    struct cmsghdr *cmsg;

    iov.iov_base = buf;
    iov.iov_len = buflen;

    msg.msg_name = NULL;
    msg.msg_namelen = 0;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    if(fd != -1){
        msg.msg_control = cmsgu.control;
        msg.msg_controllen = sizeof(cmsgu.control);

        cmsg = CMSG_FIRSTHDR(&msg);
        cmsg->cmsg_len = CMSG_LEN(sizeof(int));
        cmsg->cmsg_level = SOL_SOCKET;
        cmsg->cmsg_type = SCM_RIGHTS;

        printf("passing fd %d\n", fd);
        *((int *) CMSG_DATA(cmsg)) = fd;
    } else {
        msg.msg_control = NULL;
        msg.msg_controllen = 0;
        printf ("not passing fd\n");
    }

    size = sendmsg(sock, &msg, 0);

    if(size < 0)
        perror("sendmsg");
    return size;

}